

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_string_read_handler(void *data,uchar *buffer,size_t size,size_t *size_read)

{
  yaml_parser_t *parser;
  size_t *size_read_local;
  size_t size_local;
  uchar *buffer_local;
  void *data_local;
  
  if (*(long *)((long)data + 0x78) == *(long *)((long)data + 0x70)) {
    *size_read = 0;
  }
  else {
    size_read_local = (size_t *)size;
    if ((ulong)(*(long *)((long)data + 0x70) - *(long *)((long)data + 0x78)) < size) {
      size_read_local = (size_t *)(*(long *)((long)data + 0x70) - *(long *)((long)data + 0x78));
    }
    memcpy(buffer,*(void **)((long)data + 0x78),(size_t)size_read_local);
    *(long *)((long)data + 0x78) = (long)size_read_local + *(long *)((long)data + 0x78);
    *size_read = (size_t)size_read_local;
  }
  return 1;
}

Assistant:

static int
yaml_string_read_handler(void *data, unsigned char *buffer, size_t size,
        size_t *size_read)
{
    yaml_parser_t *parser = (yaml_parser_t *)data;

    if (parser->input.string.current == parser->input.string.end) {
        *size_read = 0;
        return 1;
    }

    if (size > (size_t)(parser->input.string.end
                - parser->input.string.current)) {
        size = parser->input.string.end - parser->input.string.current;
    }

    memcpy(buffer, parser->input.string.current, size);
    parser->input.string.current += size;
    *size_read = size;
    return 1;
}